

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O2

void __thiscall TApp_ExcludesFlags_Test::TestBody(TApp_ExcludesFlags_Test *this)

{
  App *this_00;
  input_t *piVar1;
  bool bVar2;
  Option *opt;
  Option *this_01;
  long lVar3;
  allocator local_e9;
  AssertHelper local_e8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0 [4];
  string local_c0 [32];
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,"-s,--string",(allocator *)local_e0);
  std::__cxx11::string::string((string *)&local_60,"",(allocator *)&local_e8);
  this_00 = &(this->super_TApp).app;
  opt = CLI::App::add_flag(this_00,&local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string((string *)&local_80,"--nostr",(allocator *)local_e0);
  std::__cxx11::string::string((string *)&local_a0,"",(allocator *)&local_e8);
  this_01 = CLI::App::add_flag(this_00,&local_80,&local_a0);
  CLI::Option::excludes(this_01,opt);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  TApp::run(&this->super_TApp);
  CLI::App::reset(this_00);
  std::__cxx11::string::string((string *)local_e0,"-s",(allocator *)&local_e8);
  piVar1 = &(this->super_TApp).args;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,local_e0,
             local_c0);
  std::__cxx11::string::~string((string *)local_e0);
  TApp::run(&this->super_TApp);
  CLI::App::reset(this_00);
  std::__cxx11::string::string((string *)local_e0,"--nostr",(allocator *)&local_e8);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,local_e0,
             local_c0);
  std::__cxx11::string::~string((string *)local_e0);
  TApp::run(&this->super_TApp);
  CLI::App::reset(this_00);
  std::__cxx11::string::string((string *)local_e0,"--nostr",(allocator *)&local_e8);
  std::__cxx11::string::string(local_c0,"-s",&local_e9);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,local_e0,
             &local_a0);
  lVar3 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&local_e0[0].ptr_ + lVar3));
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x20);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    TApp::run(&this->super_TApp);
  }
  testing::Message::Message((Message *)local_e0);
  testing::internal::AssertHelper::AssertHelper
            (&local_e8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x3fc,
             "Expected: run() throws an exception of type CLI::ExcludesError.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_e8,(Message *)local_e0);
  testing::internal::AssertHelper::~AssertHelper(&local_e8);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(local_e0);
  CLI::App::reset(this_00);
  std::__cxx11::string::string((string *)local_e0,"--string",(allocator *)&local_e8);
  std::__cxx11::string::string(local_c0,"--nostr",&local_e9);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,local_e0,
             &local_a0);
  lVar3 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&local_e0[0].ptr_ + lVar3));
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x20);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    TApp::run(&this->super_TApp);
  }
  testing::Message::Message((Message *)local_e0);
  testing::internal::AssertHelper::AssertHelper
            (&local_e8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x400,
             "Expected: run() throws an exception of type CLI::ExcludesError.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_e8,(Message *)local_e0);
  testing::internal::AssertHelper::~AssertHelper(&local_e8);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(local_e0);
  return;
}

Assistant:

TEST_F(TApp, ExcludesFlags) {
    CLI::Option *opt = app.add_flag("-s,--string");
    app.add_flag("--nostr")->excludes(opt);

    run();

    app.reset();
    args = {"-s"};
    run();

    app.reset();
    args = {"--nostr"};
    run();

    app.reset();
    args = {"--nostr", "-s"};
    EXPECT_THROW(run(), CLI::ExcludesError);

    app.reset();
    args = {"--string", "--nostr"};
    EXPECT_THROW(run(), CLI::ExcludesError);
}